

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kitFactor.c
# Opt level: O2

Kit_Graph_t * Kit_SopFactor(Vec_Int_t *vCover,int fCompl,int nVars,Vec_Int_t *vMemory)

{
  Kit_Edge_t KVar1;
  Kit_Graph_t *pKVar2;
  int *piVar3;
  Kit_Sop_t Sop;
  
  if (0xf < nVars) {
    __assert_fail("nVars < 16",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/bool/kit/kitFactor.c"
                  ,0x40,"Kit_Graph_t *Kit_SopFactor(Vec_Int_t *, int, int, Vec_Int_t *)");
  }
  if (vCover->nSize == 1) {
    if (*vCover->pArray == 0) {
      pKVar2 = Kit_GraphCreateConst1();
      return pKVar2;
    }
  }
  else if (vCover->nSize == 0) {
    pKVar2 = Kit_GraphCreateConst0();
    return pKVar2;
  }
  if (vMemory->nCap < 0x100000) {
    if (vMemory->pArray == (int *)0x0) {
      piVar3 = (int *)malloc(0x400000);
    }
    else {
      piVar3 = (int *)realloc(vMemory->pArray,0x400000);
    }
    vMemory->pArray = piVar3;
    if (piVar3 == (int *)0x0) {
      __assert_fail("p->pArray",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                    ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
    }
    vMemory->nCap = 0x100000;
  }
  Kit_SopCreateInverse(&Sop,vCover,nVars * 2,vMemory);
  pKVar2 = Kit_GraphCreate(nVars);
  KVar1 = Kit_SopFactor_rec(pKVar2,&Sop,nVars * 2,vMemory);
  pKVar2->eRoot = KVar1;
  if (fCompl != 0) {
    pKVar2->eRoot = (Kit_Edge_t)((uint)KVar1 ^ 1);
  }
  return pKVar2;
}

Assistant:

Kit_Graph_t * Kit_SopFactor( Vec_Int_t * vCover, int fCompl, int nVars, Vec_Int_t * vMemory )
{
    Kit_Sop_t Sop, * cSop = &Sop;
    Kit_Graph_t * pFForm;
    Kit_Edge_t eRoot;
//    int nCubes;

    // works for up to 15 variables because division procedure
    // used the last bit for marking the cubes going to the remainder
    assert( nVars < 16 );

    // check for trivial functions
    if ( Vec_IntSize(vCover) == 0 )
        return Kit_GraphCreateConst0();
    if ( Vec_IntSize(vCover) == 1 && Vec_IntEntry(vCover, 0) == 0 )
        return Kit_GraphCreateConst1();

    // prepare memory manager
//    Vec_IntClear( vMemory );
    Vec_IntGrow( vMemory, KIT_FACTOR_MEM_LIMIT );

    // perform CST
    Kit_SopCreateInverse( cSop, vCover, 2 * nVars, vMemory ); // CST

    // start the factored form
    pFForm = Kit_GraphCreate( nVars );
    // factor the cover
    eRoot = Kit_SopFactor_rec( pFForm, cSop, 2 * nVars, vMemory );
    // finalize the factored form
    Kit_GraphSetRoot( pFForm, eRoot );
    if ( fCompl )
        Kit_GraphComplement( pFForm );

    // verify the factored form
//    nCubes = Vec_IntSize(vCover);
//    Vec_IntShrink( vCover, nCubes );
//    if ( !Kit_SopFactorVerify( vCover, pFForm, nVars ) )
//        printf( "Verification has failed.\n" );
    return pFForm;
}